

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

string * clask::url_decode(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (s->_M_dataplus)._M_p;
  do {
    while( true ) {
      if (*pcVar3 == '%') break;
      if (*pcVar3 == '\0') {
        return __return_storage_ptr__;
      }
LAB_00110f14:
      pcVar3 = pcVar3 + 1;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    if ((((pcVar3[1] == '\0') || (cVar1 = pcVar3[2], cVar1 == '\0')) ||
        (iVar2 = isxdigit((int)pcVar3[1]), iVar2 == 0)) ||
       (iVar2 = isxdigit((int)cVar1), iVar2 == 0)) goto LAB_00110f14;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    pcVar3 = pcVar3 + 3;
  } while( true );
}

Assistant:

inline std::string url_decode(const std::string &s) {
  std::string ret;
  const char* p = s.c_str();
  while (*p) {
    if (*p == '%' && p[1] && p[2] && std::isxdigit(p[1]) && std::isxdigit(p[2])) {
      const int hi = p[1] - (p[1] <= '9' ? '0' : (p[1] <= 'F' ? 'A' : 'a') - 10);
      const int lo = p[2] - (p[2] <= '9' ? '0' : (p[2] <= 'F' ? 'A' : 'a') - 10);
      ret += static_cast<char>(16 * hi + lo);
      p += 3;
      continue;
    }
    ret += *p++;
  }
  return ret;
}